

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O3

int32 print_counts(char *countfn,phnhashelement_t **CIhash,hashelement_t **CDhash)

{
  FILE *pFVar1;
  int32 iVar2;
  heapelement_t *phVar3;
  char *pcVar4;
  long lVar5;
  hashelement_t *phVar6;
  phnhashelement_t *ppVar7;
  int32 ciheapsize;
  int32 cdheapsize;
  heapelement_t **CIheap;
  heapelement_t **CDheap;
  int32 local_60;
  int32 local_5c;
  FILE *local_58;
  heapelement_t **local_50;
  heapelement_t **local_48;
  phnhashelement_t **local_40;
  hashelement_t **local_38;
  
  iVar2 = 0;
  local_48 = (heapelement_t **)0x0;
  local_50 = (heapelement_t **)0x0;
  local_40 = CIhash;
  local_38 = CDhash;
  local_58 = fopen(countfn,"w");
  if (local_58 == (FILE *)0x0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x2b8,"Unable to open %s for writing. Not writing counts!\n",countfn);
    iVar2 = -1;
  }
  else {
    fwrite("base\tleft\tright\twdpos\tcount\n",0x1c,1,local_58);
    local_60 = 0;
    lVar5 = 0;
    do {
      for (ppVar7 = local_40[lVar5]; pFVar1 = local_58, ppVar7 != (phnhashelement_t *)0x0;
          ppVar7 = ppVar7->next) {
        if (0 < ppVar7->count) {
          phVar3 = (heapelement_t *)
                   __ckd_calloc__(1,0x28,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                  ,0x2c5);
          pcVar4 = strdup(ppVar7->phone);
          phVar3->basephone = pcVar4;
          phVar3->count = ppVar7->count;
          iVar2 = insert(&local_50,iVar2,phVar3);
          local_60 = iVar2;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x65);
    if (0 < iVar2) {
      do {
        phVar3 = yanktop(&local_50,local_60,&local_60);
        fprintf(pFVar1,"%s\t-\t-\t-\t%d\n",phVar3->basephone,(ulong)(uint)phVar3->count);
        free_heapelement(phVar3);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    local_5c = 0;
    iVar2 = 0;
    lVar5 = 0;
    do {
      for (phVar6 = local_38[lVar5]; pFVar1 = local_58, phVar6 != (hashelement_t *)0x0;
          phVar6 = phVar6->next) {
        if (0 < phVar6->count) {
          phVar3 = (heapelement_t *)
                   __ckd_calloc__(1,0x28,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                  ,0x2db);
          pcVar4 = strdup(phVar6->basephone);
          phVar3->basephone = pcVar4;
          pcVar4 = strdup(phVar6->leftcontext);
          phVar3->leftcontext = pcVar4;
          pcVar4 = strdup(phVar6->rightcontext);
          phVar3->rightcontext = pcVar4;
          pcVar4 = strdup(phVar6->wordposition);
          phVar3->wordposition = pcVar4;
          phVar3->count = phVar6->count;
          iVar2 = insert(&local_48,iVar2,phVar3);
          local_5c = iVar2;
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x5dc1);
    if (0 < iVar2) {
      do {
        phVar3 = yanktop(&local_48,local_5c,&local_5c);
        fprintf(pFVar1,"%s\t%s\t%s\t%s\t%d\n",phVar3->basephone,phVar3->leftcontext,
                phVar3->rightcontext,phVar3->wordposition,phVar3->count);
        free_heapelement(phVar3);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    fclose(pFVar1);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int32   print_counts(const char *countfn, phnhashelement_t  **CIhash,
		     hashelement_t **CDhash)
{
    heapelement_t **CDheap=NULL, **CIheap=NULL, *addphone, *addtriphone;
    hashelement_t *triphone_el; 
    phnhashelement_t *ciphone_el;
    int32 i, heapsize,cdheapsize,ciheapsize;
    FILE  *ofp;

    if ((ofp = fopen(countfn,"w")) == NULL){
	E_WARN("Unable to open %s for writing. Not writing counts!\n",countfn);
        return S3_ERROR;
    }
    fprintf(ofp,"base\tleft\tright\twdpos\tcount\n");

    ciheapsize = 0;
    for (i = 0; i < PHNHASHSIZE; i++){
	ciphone_el = CIhash[i];
	while (ciphone_el != NULL){
	    if (ciphone_el->count < 1) {
		ciphone_el = ciphone_el->next;
		continue;
	    }
	    addphone = (heapelement_t *) ckd_calloc(1,sizeof(heapelement_t));
	    addphone->basephone = strdup(ciphone_el->phone);
	    addphone->count = ciphone_el->count;
	    ciheapsize = insert(&CIheap, ciheapsize, addphone);
	    ciphone_el = ciphone_el->next;
        }
    }
    heapsize = ciheapsize;
    for (i = 0; i < heapsize; i++) {
        addphone = yanktop(&CIheap,ciheapsize,&ciheapsize);
	fprintf(ofp,"%s\t-\t-\t-\t%d\n",addphone->basephone,addphone->count);
	free_heapelement(addphone);
    }

    cdheapsize = 0;
    for (i = 0; i < HASHSIZE; i++){
	triphone_el = CDhash[i];
	while (triphone_el != NULL){
	    if (triphone_el->count < 1) {
		triphone_el = triphone_el->next;
		continue;
	    }
	    addtriphone = (heapelement_t *) ckd_calloc(1,sizeof(heapelement_t));
	    addtriphone->basephone = strdup(triphone_el->basephone);
	    addtriphone->leftcontext = strdup(triphone_el->leftcontext);
	    addtriphone->rightcontext = strdup(triphone_el->rightcontext);
	    addtriphone->wordposition = strdup(triphone_el->wordposition);
	    addtriphone->count = triphone_el->count;
	    cdheapsize = insert(&CDheap, cdheapsize, addtriphone);
	    triphone_el = triphone_el->next;
        }
    }
    heapsize = cdheapsize;
    for (i = 0; i < heapsize; i++) {
        addtriphone = yanktop(&CDheap,cdheapsize,&cdheapsize);
	fprintf(ofp,"%s\t%s\t%s\t%s\t%d\n",addtriphone->basephone,
					   addtriphone->leftcontext,
					   addtriphone->rightcontext,
					   addtriphone->wordposition,
					   addtriphone->count);
	free_heapelement(addtriphone);
    }
    fclose(ofp);
    return S3_SUCCESS;
}